

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O1

void __thiscall Epoll::epoll_del(Epoll *this,int fd,int event)

{
  ulong uVar1;
  int iVar2;
  _Hash_node_base *p_Var3;
  ulong uVar4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  epoll_event ev;
  uint local_1c;
  int local_18;
  
  uVar1 = (this->ep_event_map)._M_h._M_bucket_count;
  uVar4 = (ulong)(long)fd % uVar1;
  p_Var5 = (this->ep_event_map)._M_h._M_buckets[uVar4];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var5->_M_nxt, p_Var6 = p_Var5, *(int *)&p_Var5->_M_nxt[1]._M_nxt != fd)) {
    while (p_Var5 = p_Var3, p_Var3 = p_Var5->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)(long)*(int *)&p_Var3[1]._M_nxt % uVar1 != uVar4) ||
         (p_Var6 = p_Var5, *(int *)&p_Var3[1]._M_nxt == fd)) goto LAB_00108f28;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_00108f28:
  if (p_Var6 == (__node_base_ptr)0x0) {
    p_Var3 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var3 = p_Var6->_M_nxt;
  }
  if (p_Var3 != (_Hash_node_base *)0x0) {
    local_1c = ~event & *(uint *)&p_Var3[2]._M_nxt;
    *(uint *)&p_Var3[2]._M_nxt = local_1c;
    if (local_1c == 0) {
      epoll_del(this,fd);
      return;
    }
    local_18 = fd;
    iVar2 = epoll_ctl(this->ep_epoll_fd,3,fd,(epoll_event *)&local_1c);
    if ((iVar2 == -1) && (-1 < pr_level)) {
      printf("[%-5s][%s:%d] epoll ctl error for fd %d\n","error","epoll_del",0x47,fd);
    }
  }
  return;
}

Assistant:

void Epoll::epoll_del(int fd, int event) {

    ep_event_map_iter ret;
    if (ret = ep_event_map.find(fd); ret == ep_event_map.end()) {
        return ;
    }

    int &target_event = ret->second.event;

    if (target_event = target_event & (~event); target_event == 0) {
        this->epoll_del(fd);
    }
    else {
        struct epoll_event ev;
        ev.events = target_event;
        ev.data.fd = fd;
        if (epoll_ctl(ep_epoll_fd, EPOLL_CTL_MOD, fd, &ev) == -1) {
            PR_ERROR("epoll ctl error for fd %d\n", fd);
            return;
        }
    }
}